

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_bignum_sub_digits(sexp ctx,sexp dst,sexp a,sexp b)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  sexp_uint_t sVar4;
  sexp_uint_t sVar5;
  sexp psVar6;
  sexp_sint_t sVar7;
  sexp_uint_t sVar8;
  long lVar9;
  bool bVar10;
  sexp_conflict local_48;
  sexp_gc_var_t local_40;
  
  sVar4 = sexp_bignum_hi(a);
  sVar5 = sexp_bignum_hi(b);
  local_48 = (sexp_conflict)0x43e;
  if (sVar4 < sVar5) {
LAB_00118d03:
    psVar6 = sexp_bignum_sub_digits(ctx,dst,b,a);
    return psVar6;
  }
  if (sVar4 == sVar5) {
    sVar7 = sexp_bignum_compare_abs(a,b);
    if (sVar7 < 0) goto LAB_00118d03;
  }
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  local_40.var = &local_48;
  if (dst != (sexp)0x0) {
    local_40.var = &local_48;
    sVar8 = sexp_bignum_hi(dst);
    if (sVar4 <= sVar8) goto LAB_00118d78;
  }
  dst = sexp_copy_bignum(ctx,(sexp)0x0,a,0);
LAB_00118d78:
  lVar9 = 0;
  for (sVar8 = 0; sVar5 != sVar8; sVar8 = sVar8 + 1) {
    uVar2 = *(ulong *)((long)&a->value + sVar8 * 8 + 0x10);
    uVar3 = *(ulong *)((long)&b->value + sVar8 * 8 + 0x10);
    if ((uVar3 < uVar2) || ((lVar9 == 0 && (uVar2 == uVar3)))) {
      *(ulong *)((long)&dst->value + sVar8 * 8 + 0x10) = uVar2 - (lVar9 + uVar3);
      lVar9 = 0;
    }
    else {
      *(ulong *)((long)&dst->value + sVar8 * 8 + 0x10) = -(uVar3 + lVar9);
      *(ulong *)((long)&dst->value + sVar8 * 8 + 0x10) =
           *(long *)((long)&a->value + sVar8 * 8 + 0x10) - (uVar3 + lVar9);
      lVar9 = 1;
    }
  }
  bVar10 = lVar9 != 0;
  for (; (bVar10 && (sVar5 < sVar4)); sVar5 = sVar5 + 1) {
    plVar1 = (long *)((long)&dst->value + sVar5 * 8 + 0x10);
    bVar10 = *plVar1 == 0;
    *plVar1 = *plVar1 + -1;
  }
  (ctx->value).context.saves = local_40.next;
  return dst;
}

Assistant:

sexp sexp_bignum_sub_digits (sexp ctx, sexp dst, sexp a, sexp b) {
  sexp_uint_t alen=sexp_bignum_hi(a), blen=sexp_bignum_hi(b),
    borrow=0, i, *adata, *bdata, *cdata;
  sexp_gc_var1(c);
  if ((alen < blen) || ((alen == blen) && (sexp_bignum_compare_abs(a, b) < 0)))
    return sexp_bignum_sub_digits(ctx, dst, b, a);
  sexp_gc_preserve1(ctx, c);
  c = ((dst && sexp_bignum_hi(dst) >= alen)
       ? dst : sexp_copy_bignum(ctx, NULL, a, 0));
  adata = sexp_bignum_data(a);
  bdata = sexp_bignum_data(b);
  cdata = sexp_bignum_data(c);
  for (i=0; i<blen; i++) {
    if (adata[i] > bdata[i] || (adata[i] == bdata[i] && !borrow)) {
      cdata[i] = adata[i] - bdata[i] - borrow;
      borrow = 0;
    } else {
      cdata[i] = (SEXP_UINT_T_MAX - bdata[i]);
      cdata[i] += 1;
      cdata[i] -= borrow;
      cdata[i] += adata[i];
      borrow = 1;
    }
  }
  for ( ; borrow && (i<alen); i++) {
    borrow = (cdata[i] == 0 ? 1 : 0);
    cdata[i]--;
  }
  sexp_gc_release1(ctx);
  return c;
}